

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,Register8Bits dest,ExtendedRegisters srcMemReg,int offset)

{
  ulong local_28;
  size_t i;
  IntToBytes converter;
  ExtendedRegisters local_12;
  Register8Bits local_11;
  int offset_local;
  ExtendedRegisters srcMemReg_local;
  Register8Bits dest_local;
  CodeGen *codeGen_local;
  
  i._7_1_ = 0x41;
  converter.intValue = offset;
  local_12 = srcMemReg;
  local_11 = dest;
  _offset_local = codeGen;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (codeGen,(value_type_conflict1 *)((long)&i + 7));
  i._6_1_ = 0x8a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_offset_local,(value_type_conflict1 *)((long)&i + 6));
  i._5_1_ = local_12 | 0x80 | local_11 << 3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_offset_local,(value_type_conflict1 *)((long)&i + 5));
  i._0_4_ = converter;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,(value_type_conflict1 *)((long)&i + local_28));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, Register8Bits dest, ExtendedRegisters srcMemReg, int offset) {
		codeGen.push_back(0x41);
		codeGen.push_back(0x8a);
		codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}